

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

BrandInitializerText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandInitializers
          (BrandInitializerText *__return_storage_ptr__,CapnpcCppMain *this,
          TemplateContext *templateContext,Schema schema)

{
  bool bVar1;
  size_type sVar2;
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  *depMap_00;
  char *in_R8;
  Iterator IVar3;
  Reader RVar4;
  char (*in_stack_fffffffffffffd20) [11];
  Array<kj::StringTree> local_260;
  Array<kj::StringTree> local_248;
  size_type local_230;
  size_type dependencyCount;
  undefined1 local_220 [8];
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  depMap;
  StringTree local_1e0;
  undefined1 local_1a8 [8];
  Reader param;
  undefined1 local_168 [8];
  Iterator __end3;
  undefined1 local_148 [8];
  Iterator __begin3;
  Reader *__range3;
  size_t local_128;
  CappedArray<char,_17UL> local_120;
  StringTree local_100;
  reference local_c8;
  pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>
  *scope;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  *__range2;
  Vector<kj::StringTree> bindings;
  undefined1 local_78 [8];
  ArrayBuilder<kj::StringTree> scopes;
  map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  scopeMap;
  TemplateContext *templateContext_local;
  CapnpcCppMain *this_local;
  Schema schema_local;
  
  TemplateContext::getScopeMap
            ((map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
              *)&scopes.disposer,templateContext);
  sVar2 = std::
          map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
          ::size((map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
                  *)&scopes.disposer);
  kj::heapArrayBuilder<kj::StringTree>((ArrayBuilder<kj::StringTree> *)local_78,sVar2);
  sVar2 = std::
          map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
          ::size((map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
                  *)&scopes.disposer);
  kj::Vector<kj::StringTree>::Vector((Vector<kj::StringTree> *)&__range2,sVar2 * 2);
  __end2 = std::
           map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
           ::begin((map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
                    *)&scopes.disposer);
  scope = (pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>
           *)std::
             map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
             ::end((map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
                    *)&scopes.disposer);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&scope);
    if (!bVar1) break;
    local_c8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>
               ::operator*(&__end2);
    kj::hex(&local_120,local_c8->first);
    local_128 = kj::Vector<kj::StringTree>::size((Vector<kj::StringTree> *)&__range2);
    __range3._4_4_ =
         List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_c8->second);
    in_R8 = ", brandBindings + ";
    kj::
    strTree<char_const(&)[5],char_const(&)[3],kj::CappedArray<char,17ul>,char_const(&)[19],unsigned_long,char_const(&)[3],unsigned_int,char_const(&)[11]>
              (&local_100,(kj *)"  { ",(char (*) [5])0x41806e,(char (*) [3])&local_120,
               (CappedArray<char,_17UL> *)", brandBindings + ",(char (*) [19])&local_128,
               (unsigned_long *)0x4197eb,(char (*) [3])((long)&__range3 + 4),(uint *)", false},\n",
               in_stack_fffffffffffffd20);
    kj::ArrayBuilder<kj::StringTree>::add<kj::StringTree>
              ((ArrayBuilder<kj::StringTree> *)local_78,&local_100);
    kj::StringTree::~StringTree(&local_100);
    __begin3._8_8_ = &local_c8->second;
    IVar3 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)__begin3._8_8_);
    __end3._8_8_ = IVar3.container;
    __begin3.container._0_4_ = IVar3.index;
    local_148 = (undefined1  [8])__end3._8_8_;
    IVar3 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::end
                      ((Reader *)__begin3._8_8_);
    param._reader._40_8_ = IVar3.container;
    __end3.container._0_4_ = IVar3.index;
    local_168 = (undefined1  [8])param._reader._40_8_;
    while( true ) {
      bVar1 = _::
              IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
              ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                            *)local_148,
                           (IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                            *)local_168);
      if (!bVar1) break;
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
      ::operator*((Reader *)local_1a8,
                  (IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                   *)local_148);
      RVar4 = capnp::schema::Node::Parameter::Reader::getName((Reader *)local_1a8);
      depMap._M_t._M_impl.super__Rb_tree_header._M_node_count = RVar4.super_StringPtr.content.ptr;
      kj::strTree<char_const(&)[31],capnp::Text::Reader,char_const(&)[6]>
                (&local_1e0,(kj *)"  ::capnp::_::brandBindingFor<",
                 (char (*) [31])&depMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Reader *)">(),\n",(char (*) [6])in_R8);
      kj::Vector<kj::StringTree>::add<kj::StringTree>
                ((Vector<kj::StringTree> *)&__range2,&local_1e0);
      kj::StringTree::~StringTree(&local_1e0);
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                    *)local_148);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>
    ::operator++(&__end2);
  }
  dependencyCount = (size_type)schema.raw;
  makeBrandDepMap((map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                   *)local_220,this,templateContext,schema);
  local_230 = std::
              map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
              ::size((map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                      *)local_220);
  kj::ArrayBuilder<kj::StringTree>::finish(&local_248,(ArrayBuilder<kj::StringTree> *)local_78);
  kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
            (&__return_storage_ptr__->scopes,(kj *)0x41956e,(char (*) [3])&local_248,
             (Array<kj::StringTree> *)"}",(char (*) [2])in_R8);
  kj::Vector<kj::StringTree>::releaseAsArray(&local_260,(Vector<kj::StringTree> *)&__range2);
  kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
            (&__return_storage_ptr__->bindings,(kj *)0x41956e,(char (*) [3])&local_260,
             (Array<kj::StringTree> *)"}",(char (*) [2])in_R8);
  depMap_00 = kj::
              mv<std::map<unsigned_int,kj::StringTree,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kj::StringTree>>>>
                        ((map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                          *)local_220);
  makeBrandDepInitializers(&__return_storage_ptr__->dependencies,this,depMap_00);
  __return_storage_ptr__->dependencyCount = local_230;
  kj::Array<kj::StringTree>::~Array(&local_260);
  kj::Array<kj::StringTree>::~Array(&local_248);
  std::
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  ::~map((map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
          *)local_220);
  kj::Vector<kj::StringTree>::~Vector((Vector<kj::StringTree> *)&__range2);
  kj::ArrayBuilder<kj::StringTree>::~ArrayBuilder((ArrayBuilder<kj::StringTree> *)local_78);
  std::
  map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  ::~map((map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
          *)&scopes.disposer);
  return __return_storage_ptr__;
}

Assistant:

BrandInitializerText makeBrandInitializers(
      const TemplateContext& templateContext, Schema schema) {
    auto scopeMap = templateContext.getScopeMap();

    auto scopes = kj::heapArrayBuilder<kj::StringTree>(scopeMap.size());
    kj::Vector<kj::StringTree> bindings(scopeMap.size() * 2);  // (estimate two params per scope)

    for (auto& scope: scopeMap) {
      scopes.add(kj::strTree("  { ",
        "0x", kj::hex(scope.first), ", "
        "brandBindings + ", bindings.size(), ", ",
        scope.second.size(), ", "
        "false"
      "},\n"));

      for (auto param: scope.second) {
        bindings.add(kj::strTree("  ::capnp::_::brandBindingFor<", param.getName(), ">(),\n"));
      }
    }

    auto depMap = makeBrandDepMap(templateContext, schema);
    auto dependencyCount = depMap.size();
    return {
      kj::strTree("{\n", scopes.finish(), "}"),
      kj::strTree("{\n", bindings.releaseAsArray(), "}"),
      makeBrandDepInitializers(kj::mv(depMap)),
      dependencyCount
    };
  }